

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O0

void ggml_compute_forward_pool_2d(ggml_compute_params *params,ggml_tensor *dst)

{
  float *pfVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int *piVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  long in_RSI;
  int *in_RDI;
  float srow_j;
  int j;
  int kx;
  void *srow;
  int ky;
  int iy;
  int ix;
  float *out;
  int ox;
  float *drow;
  int oy;
  int offset1;
  int offset0;
  int ka;
  float *dplane;
  int64_t pa;
  int64_t py;
  int64_t px;
  char *data_end;
  char *cdata;
  int p1;
  int p0;
  int s1;
  int s0;
  int k1;
  int k0;
  ggml_op_pool op;
  int32_t *opts;
  ggml_tensor *src;
  float local_d0;
  int local_b4;
  int local_a4;
  int local_8c;
  int local_80;
  long local_70;
  ulong local_48;
  
  piVar9 = *(int **)(in_RSI + 0x98);
  if (*in_RDI == 0) {
    iVar2 = *(int *)(in_RSI + 0x54);
    iVar3 = *(int *)(in_RSI + 0x58);
    iVar4 = *(int *)(in_RSI + 0x5c);
    iVar5 = *(int *)(in_RSI + 0x60);
    iVar6 = *(int *)(in_RSI + 100);
    iVar7 = *(int *)(in_RSI + 0x68);
    iVar8 = *(int *)(in_RSI + 0x6c);
    local_48 = *(ulong *)(piVar9 + 0x3e);
    lVar13 = ggml_nbytes(piVar9);
    uVar14 = local_48 + lVar13;
    lVar13 = *(long *)(in_RSI + 0x10);
    lVar10 = *(long *)(in_RSI + 0x18);
    local_70 = *(long *)(in_RSI + 0xf8);
    for (; local_48 < uVar14; local_48 = *(long *)(piVar9 + 0x10) + local_48) {
      for (local_80 = 0; local_80 < lVar10; local_80 = local_80 + 1) {
        for (local_8c = 0; local_8c < lVar13; local_8c = local_8c + 1) {
          pfVar1 = (float *)(local_70 + local_80 * lVar13 * 4 + (long)local_8c * 4);
          if (iVar2 == 0) {
            *pfVar1 = -3.4028235e+38;
          }
          else if (iVar2 == 1) {
            *pfVar1 = 0.0;
          }
          else if (iVar2 == 2) {
            ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ops.cpp"
                       ,0x18cf,"fatal error");
          }
          iVar11 = local_80 * iVar6 - iVar8;
          for (local_a4 = 0; local_a4 < iVar4; local_a4 = local_a4 + 1) {
            if ((-1 < iVar11 + local_a4) && ((long)(iVar11 + local_a4) < *(long *)(piVar9 + 6))) {
              lVar15 = local_48 + *(long *)(piVar9 + 0xe) * (long)(iVar11 + local_a4);
              for (local_b4 = 0; local_b4 < iVar3; local_b4 = local_b4 + 1) {
                iVar12 = (local_8c * iVar5 - iVar7) + local_b4;
                if ((-1 < iVar12) && ((long)iVar12 < *(long *)(piVar9 + 4))) {
                  if (*piVar9 == 0) {
                    local_d0 = *(float *)(lVar15 + (long)iVar12 * 4);
                  }
                  else {
                    local_d0 = ggml_lookup_fp16_to_fp32(*(ggml_fp16_t *)(lVar15 + (long)iVar12 * 2))
                    ;
                  }
                  if (iVar2 == 0) {
                    if (*pfVar1 < local_d0) {
                      *pfVar1 = local_d0;
                    }
                  }
                  else if (iVar2 == 1) {
                    *pfVar1 = local_d0 + *pfVar1;
                  }
                  else if (iVar2 == 2) {
                    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ops.cpp"
                               ,0x18df,"fatal error");
                  }
                }
              }
            }
          }
          if (iVar2 != 0) {
            if (iVar2 == 1) {
              *pfVar1 = *pfVar1 / (float)(iVar3 * iVar4);
            }
            else if (iVar2 == 2) {
              ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ops.cpp"
                         ,0x18e6,"fatal error");
            }
          }
        }
      }
      local_70 = lVar13 * lVar10 * 4 + local_70;
    }
  }
  return;
}

Assistant:

void ggml_compute_forward_pool_2d(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src = dst->src[0];

    assert(src->type == GGML_TYPE_F32 || src->type == GGML_TYPE_F16);

    if (params->ith != 0) {
        return;
    }

    const int32_t * opts = (const int32_t *)dst->op_params;
    ggml_op_pool op = static_cast<ggml_op_pool>(opts[0]);
    const int k0 = opts[1];
    const int k1 = opts[2];
    const int s0 = opts[3];
    const int s1 = opts[4];
    const int p0 = opts[5];
    const int p1 = opts[6];
    const char * cdata = (const char*)src->data;
    const char * const data_end = cdata + ggml_nbytes(src);

    const int64_t px = dst->ne[0];
    const int64_t py = dst->ne[1];
    const int64_t pa = px * py;

    float * dplane = (float *)dst->data;

    const int ka = k0 * k1;
    const int offset0 = -p0;
    const int offset1 = -p1;

    while (cdata < data_end) {
        for (int oy = 0; oy < py; ++oy) {
            float * const drow = dplane + oy * px;
            for (int ox = 0; ox < px; ++ox) {
                float * const out =  drow + ox;
                switch (op) {
                    case GGML_OP_POOL_AVG:     *out = 0;        break;
                    case GGML_OP_POOL_MAX:     *out = -FLT_MAX; break;
                    case GGML_OP_POOL_COUNT: GGML_ABORT("fatal error");
                }

                const int ix = offset0 + ox * s0;
                const int iy = offset1 + oy * s1;

                for (int ky = 0; ky < k1; ++ky) {
                    if (iy + ky < 0 || iy + ky >= src->ne[1]) continue;
                    const void * srow = (const void *)(cdata + src->nb[1] * (iy + ky));
                    for (int kx = 0; kx < k0; ++kx) {
                        int j = ix + kx;
                        if (j < 0 || j >= src->ne[0]) continue;
                        const float srow_j = (src->type == GGML_TYPE_F32) ? ((const float*)srow)[j] : GGML_FP16_TO_FP32(((const ggml_fp16_t*)srow)[j]);
                        switch (op) {
                            case GGML_OP_POOL_AVG:                     *out += srow_j; break;
                            case GGML_OP_POOL_MAX: if (srow_j > *out)  *out  = srow_j; break;
                            case GGML_OP_POOL_COUNT:               GGML_ABORT("fatal error");
                        }
                    }
                }
                switch (op) {
                    case GGML_OP_POOL_AVG:           *out /= ka; break;
                    case GGML_OP_POOL_MAX:                       break;
                    case GGML_OP_POOL_COUNT: GGML_ABORT("fatal error");
                }
            }
        }

        cdata  += src->nb[2];
        dplane += pa;
    }
}